

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O0

bool Js::JavascriptNativeOperators::CheckIfTypeIsEquivalentForFixedField
               (Type *type,JitEquivalentTypeGuard *guard)

{
  intptr_t iVar1;
  JitEquivalentTypeGuard *guard_local;
  Type *type_local;
  
  iVar1 = PropertyGuard::GetValue((PropertyGuard *)guard);
  if (iVar1 == 2) {
    type_local._7_1_ = false;
  }
  else {
    type_local._7_1_ = CheckIfTypeIsEquivalent(type,guard);
  }
  return type_local._7_1_;
}

Assistant:

bool JavascriptNativeOperators::CheckIfTypeIsEquivalentForFixedField(Type* type, JitEquivalentTypeGuard* guard)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(CheckIfTypeIsEquivalentForFixedField);
        JIT_HELPER_SAME_ATTRIBUTES(CheckIfTypeIsEquivalentForFixedField, CheckIfTypeIsEquivalent);
        if (guard->GetValue() == PropertyGuard::GuardValue::Invalidated_DuringSweep)
        {
            return false;
        }
        return CheckIfTypeIsEquivalent(type, guard);
        JIT_HELPER_END(CheckIfTypeIsEquivalentForFixedField);
    }